

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int threadsTest(char *filename,char *resul,char *err,int options)

{
  int iVar1;
  long lVar2;
  xmlThreadParams *__arg;
  int iVar3;
  int *piVar4;
  char *__ptr;
  ulong uVar5;
  size_t sStack_50;
  int local_3c;
  void *result;
  
  xmlInitParser();
  iVar3 = 0;
  local_3c = 0;
  do {
    if (iVar3 == 500) {
      return local_3c;
    }
    xmlLoadCatalog();
    nb_tests = nb_tests + 1;
    for (lVar2 = 0; lVar2 != 0x38; lVar2 = lVar2 + 8) {
      *(undefined8 *)((long)tid + lVar2) = 0xffffffffffffffff;
    }
    __arg = threadParams;
    lVar2 = 0;
    while (lVar2 + 8 != 0x40) {
      iVar1 = pthread_create((pthread_t *)((long)tid + lVar2),(pthread_attr_t *)0x0,
                             thread_specific_data,__arg);
      __arg = __arg + 1;
      lVar2 = lVar2 + 8;
      if (iVar1 != 0) {
        __ptr = "pthread_create failed\n";
        sStack_50 = 0x16;
        goto LAB_0010b2d2;
      }
    }
    for (lVar2 = 0; lVar2 != 0x38; lVar2 = lVar2 + 8) {
      iVar1 = pthread_join(*(pthread_t *)((long)tid + lVar2),&result);
      if (iVar1 != 0) {
        __ptr = "pthread_join failed\n";
        sStack_50 = 0x14;
LAB_0010b2d2:
        fwrite(__ptr,sStack_50,1,_stderr);
        return 1;
      }
    }
    xmlCatalogCleanup();
    piVar4 = &threadParams[0].okay;
    for (uVar5 = 0; uVar5 != 7; uVar5 = uVar5 + 1) {
      if (*piVar4 == 0) {
        fprintf(_stderr,"Thread %d handling %s failed\n",uVar5 & 0xffffffff,
                ((xmlThreadParams *)(piVar4 + -2))->filename);
        local_3c = 1;
      }
      piVar4 = piVar4 + 4;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static int
testThread(void)
{
    unsigned int i, repeat;
    int ret;
    int res = 0;

    xmlInitParser();

    for (repeat = 0; repeat < 500; repeat++) {
        xmlLoadCatalog(catalog);
        nb_tests++;

        for (i = 0; i < num_threads; i++) {
            tid[i] = (pthread_t) - 1;
        }

        for (i = 0; i < num_threads; i++) {
            ret = pthread_create(&tid[i], 0, thread_specific_data,
                                 (void *) &threadParams[i]);
            if (ret != 0) {
                fprintf(stderr, "pthread_create failed\n");
                return (1);
            }
        }
        for (i = 0; i < num_threads; i++) {
            void *result;
            ret = pthread_join(tid[i], &result);
            if (ret != 0) {
                fprintf(stderr, "pthread_join failed\n");
                return (1);
            }
        }

        xmlCatalogCleanup();
        for (i = 0; i < num_threads; i++)
            if (threadParams[i].okay == 0) {
                fprintf(stderr, "Thread %d handling %s failed\n",
                        i, threadParams[i].filename);
                res = 1;
            }
    }
    return (res);
}